

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConeShape.cpp
# Opt level: O2

void __thiscall btConeShape::btConeShape(btConeShape *this,btScalar radius,btScalar height)

{
  float fVar1;
  
  btConvexInternalShape::btConvexInternalShape(&this->super_btConvexInternalShape);
  (this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
  _vptr_btCollisionShape = (_func_int **)&PTR__btConvexShape_001ee4c8;
  this->m_radius = radius;
  this->m_height = height;
  (this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.m_shapeType = 0xb;
  setConeUpIndex(this,1);
  fVar1 = this->m_radius;
  *(float *)&(this->super_btConvexInternalShape).field_0x44 =
       fVar1 / SQRT(fVar1 * fVar1 + this->m_height * this->m_height);
  return;
}

Assistant:

btConeShape::btConeShape (btScalar radius,btScalar height): btConvexInternalShape (),
m_radius (radius),
m_height(height)
{
	m_shapeType = CONE_SHAPE_PROXYTYPE;
	setConeUpIndex(1);
	btVector3 halfExtents;
	m_sinAngle = (m_radius / btSqrt(m_radius * m_radius + m_height * m_height));
}